

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::EOR_ID_Y(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  byte bVar4;
  
  this->cycles = 5;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  uVar2 = ReadWord(this,(ushort)iVar3 & 0xff);
  this->cycles = this->cycles - 1;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->Y + uVar2));
  bVar1 = this->A;
  bVar4 = bVar1 ^ (byte)iVar3;
  this->A = bVar4;
  (this->field_6).ps = bVar4 & 0x80 | (bVar1 == (byte)iVar3) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_ID_Y()
{
    cycles = 5;
    A ^= ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}